

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOEffect.cpp
# Opt level: O1

void __thiscall KDIS::DATA_TYPE::IOEffect::Decode(IOEffect *this,KDataStream *stream)

{
  KException *this_00;
  KUINT16 KVar1;
  KString local_40;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (0xf < KVar1) {
    StandardVariable::Decode(&this->super_StandardVariable,stream);
    KDataStream::Read(stream,&(this->super_StandardVariable).field_0xe);
    KDataStream::Read(stream,&(this->super_StandardVariable).field_0xf);
    KDataStream::Read(stream,&this->m_ui8Eff);
    KDataStream::Read(stream,&this->m_ui8EffDtyCyc);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16EffDur);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16Proc);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16Padding);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Decode","");
  KException::KException(this_00,&local_40,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void IOEffect::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < IO_EFFECT_TYPE_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    StandardVariable::Decode( stream );

    stream >> m_ui8Status
           >> m_ui8LnkTyp
           >> m_ui8Eff
           >> m_ui8EffDtyCyc
           >> m_ui16EffDur
           >> m_ui16Proc
           >> m_ui16Padding;
}